

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_scanEndTag(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char *pcVar1;
  uint local_54;
  uint local_44;
  uint local_34;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 2) {
    return -1;
  }
  if (ptr[1] == '\0') {
    local_34 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  }
  else {
    local_34 = unicode_byte_type(ptr[1],*ptr);
  }
  switch(local_34) {
  case 5:
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    *nextTokPtr = ptr;
    return 0;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    *nextTokPtr = ptr;
    return 0;
  default:
    *nextTokPtr = ptr;
    return 0;
  case 0x1d:
    if ((namingBitmap
         [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)ptr[1]] * 8 + ((int)(uint)(byte)*ptr >> 5))]
        & 1 << (*ptr & 0x1fU)) == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
  case 0x16:
  case 0x18:
    end_local = ptr + 2;
    do {
      if ((long)end - (long)end_local < 2) {
        return -1;
      }
      if (end_local[1] == '\0') {
        local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
      }
      else {
        local_44 = unicode_byte_type(end_local[1],*end_local);
      }
      switch(local_44) {
      case 5:
        if ((long)end - (long)end_local < 2) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      case 6:
        if ((long)end - (long)end_local < 3) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      case 7:
        if ((long)end - (long)end_local < 4) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      default:
        *nextTokPtr = end_local;
        return 0;
      case 9:
      case 10:
      case 0x15:
        while( true ) {
          do {
            pcVar1 = end_local;
            end_local = pcVar1 + 2;
            if ((long)end - (long)end_local < 2) {
              return -1;
            }
            if (pcVar1[3] == '\0') {
              local_54 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
            }
            else {
              local_54 = unicode_byte_type(pcVar1[3],*end_local);
            }
          } while (local_54 - 9 < 2);
          if (local_54 == 0xb) break;
          if (local_54 != 0x15) {
            *nextTokPtr = end_local;
            return 0;
          }
        }
        *nextTokPtr = pcVar1 + 4;
        return 5;
      case 0xb:
        *nextTokPtr = end_local + 2;
        return 5;
      case 0x1d:
        if ((namingBitmap
             [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)end_local[1]] * 8 +
                   ((int)(uint)(byte)*end_local >> 5))] & 1 << (*end_local & 0x1fU)) == 0) {
          *nextTokPtr = end_local;
          return 0;
        }
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        end_local = end_local + 2;
      }
    } while( true );
  }
  if ((long)end - (long)ptr < 2) {
    return -2;
  }
  *nextTokPtr = ptr;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(scanEndTag)(const ENCODING *enc, const char *ptr,
                   const char *end, const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      for (ptr += MINBPC(enc); HAS_CHAR(enc, ptr, end); ptr += MINBPC(enc)) {
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S: case BT_CR: case BT_LF:
          break;
        case BT_GT:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_END_TAG;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      return XML_TOK_PARTIAL;
#ifdef XML_NS
    case BT_COLON:
      /* no need to check qname syntax here,
         since end-tag must match exactly */
      ptr += MINBPC(enc);
      break;
#endif
    case BT_GT:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_END_TAG;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}